

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::GetVertexArrayIndexedTest::iterate
          (GetVertexArrayIndexedTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  int iVar38;
  ContextType ctxType;
  undefined4 uVar39;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  undefined1 auVar41 [16];
  long lVar40;
  
  iVar38 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar40 = CONCAT44(extraout_var_00,iVar38);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    PrepareVAO(this);
    bVar1 = Check(this,0x8622,0,1);
    bVar2 = Check(this,0x8622,1,1);
    bVar3 = Check(this,0x8622,2,1);
    bVar4 = Check(this,0x8622,3,1);
    bVar5 = Check(this,0x8622,5,0);
    bVar6 = Check(this,0x8624,0,0);
    bVar7 = Check(this,0x8624,1,2);
    bVar8 = Check(this,0x8624,2,0);
    bVar9 = Check(this,0x8624,3,8);
    bVar10 = Check(this,0x8625,0,0x1400);
    bVar11 = Check(this,0x8625,1,0x1402);
    bVar12 = Check(this,0x8625,2,0x1406);
    bVar13 = Check(this,0x8625,3,0x8368);
    bVar14 = Check(this,0x886a,0,1);
    bVar15 = Check(this,0x886a,1,0);
    bVar16 = Check(this,0x886a,2,0);
    bVar17 = Check(this,0x886a,3,0);
    bVar18 = Check(this,0x88fd,0,0);
    bVar19 = Check(this,0x88fd,1,1);
    bVar20 = Check(this,0x88fd,2,0);
    bVar21 = Check(this,0x88fd,3,0);
    bVar22 = Check(this,0x88fe,0,3);
    bVar23 = Check(this,0x88fe,1,2);
    bVar24 = Check(this,0x88fe,2,1);
    bVar25 = Check(this,0x88fe,3,0);
    bVar26 = Check(this,0x874e,0,0);
    bVar27 = Check(this,0x874e,1,0);
    bVar28 = Check(this,0x874e,2,0);
    bVar29 = Check(this,0x874e,3,0);
    bVar30 = Check(this,0x82d5,0,0);
    bVar31 = Check(this,0x82d5,1,0);
    bVar32 = Check(this,0x82d5,2,4);
    bVar33 = Check(this,0x82d5,3,0);
    bVar34 = Check64(this,0x82d7,0,0);
    bVar35 = Check64(this,0x82d7,1,2);
    bVar36 = Check64(this,0x82d7,2,8);
    bVar37 = Check64(this,0x82d7,3,4);
    uVar39 = (undefined4)CONCAT71(extraout_var,bVar37);
    if (this->m_vao != 0) {
      uVar39 = (**(code **)(lVar40 + 0x490))(1);
      this->m_vao = 0;
    }
    auVar41._0_4_ = -(uint)(this->m_bo[0] == 0);
    auVar41._4_4_ = -(uint)(this->m_bo[1] == 0);
    auVar41._8_4_ = -(uint)(this->m_bo[2] == 0);
    auVar41._12_4_ = -(uint)(this->m_bo[3] == 0);
    iVar38 = movmskps(uVar39,auVar41);
    if (iVar38 != 0xf) {
      (**(code **)(lVar40 + 0x438))(4);
      this->m_bo[0] = 0;
      this->m_bo[1] = 0;
      this->m_bo[2] = 0;
      this->m_bo[3] = 0;
    }
    do {
      iVar38 = (**(code **)(lVar40 + 0x800))();
    } while (iVar38 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((((((((bVar30 && bVar31) && bVar32) && bVar33) && bVar34) && bVar35) && bVar36) && bVar37)
        && (((((((bVar23 && bVar24) && bVar25) && bVar26) && bVar27) && bVar28) && bVar29) &&
           ((((((bVar17 && bVar18) && bVar19) && bVar20) && bVar21) && bVar22) &&
           (((((bVar12 && bVar13) && bVar14) && bVar15) && bVar16) &&
           ((((bVar8 && bVar9) && bVar10) && bVar11) &&
           (((bVar5 && bVar6) && bVar7) && ((bVar3 && bVar4) && (bVar1 && bVar2)))))))) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetVertexArrayIndexedTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		PrepareVAO();

		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_ENABLED, 0, GL_TRUE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_ENABLED, 1, GL_TRUE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_ENABLED, 2, GL_TRUE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_ENABLED, 3, GL_TRUE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_ENABLED, 5, GL_FALSE);

		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_STRIDE, 0, 0);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_STRIDE, 1, 2);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_STRIDE, 2, 0);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_STRIDE, 3, 8);

		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_TYPE, 0, GL_BYTE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_TYPE, 1, GL_SHORT);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_TYPE, 2, GL_FLOAT);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_TYPE, 3, GL_UNSIGNED_INT_2_10_10_10_REV);

		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, 0, GL_TRUE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, 1, GL_FALSE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, 2, GL_FALSE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, 3, GL_FALSE);

		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_INTEGER, 0, GL_FALSE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_INTEGER, 1, GL_TRUE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_INTEGER, 2, GL_FALSE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_INTEGER, 3, GL_FALSE);

		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_DIVISOR, 0, 3);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_DIVISOR, 1, 2);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_DIVISOR, 2, 1);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_DIVISOR, 3, 0);

		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_LONG, 0, GL_FALSE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_LONG, 1, GL_FALSE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_LONG, 2, GL_FALSE);
		is_ok &= Check(GL_VERTEX_ATTRIB_ARRAY_LONG, 3, GL_FALSE);

		is_ok &= Check(GL_VERTEX_ATTRIB_RELATIVE_OFFSET, 0, 0);
		is_ok &= Check(GL_VERTEX_ATTRIB_RELATIVE_OFFSET, 1, 0);
		is_ok &= Check(GL_VERTEX_ATTRIB_RELATIVE_OFFSET, 2, 4);
		is_ok &= Check(GL_VERTEX_ATTRIB_RELATIVE_OFFSET, 3, 0);

		is_ok &= Check64(GL_VERTEX_BINDING_OFFSET, 0, 0);
		is_ok &= Check64(GL_VERTEX_BINDING_OFFSET, 1, 2);
		is_ok &= Check64(GL_VERTEX_BINDING_OFFSET, 2, 8);
		is_ok &= Check64(GL_VERTEX_BINDING_OFFSET, 3, 4);
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (m_vao)
	{
		gl.deleteVertexArrays(1, &m_vao);

		m_vao = 0;
	}

	if (m_bo[0] || m_bo[1] || m_bo[2] || m_bo[3])
	{
		gl.deleteBuffers(4, m_bo);

		m_bo[0] = 0;
		m_bo[1] = 0;
		m_bo[2] = 0;
		m_bo[3] = 0;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}